

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O3

Vector3f __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::GetPositionForEntryId
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,int entry_id)

{
  GeometryAttribute *this_00;
  int in_EDX;
  AttributeValueIndex att_id;
  undefined4 in_register_00000034;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector3f VVar1;
  
  att_id.value_ =
       *(uint *)(*(long *)(CONCAT44(in_register_00000034,entry_id) + 0x68) + (long)in_EDX * 4);
  *(undefined4 *)
   &(this->
    super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
    attribute_ = 0;
  (this->
  super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>.
  super_PredictionSchemeTypedDecoderInterface<int,_int>.super_PredictionSchemeDecoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface = (_func_int **)0x0;
  this_00 = *(GeometryAttribute **)(CONCAT44(in_register_00000034,entry_id) + 0x60);
  if (this_00[1].field_0x24 == '\0') {
    att_id.value_ = *(uint *)(this_00[1].buffer_descriptor_.buffer_id + (ulong)att_id.value_ * 4);
  }
  GeometryAttribute::ConvertValue<float>(this_00,att_id,this_00->num_components_,(float *)this);
  VVar1.v_._M_elems[2] = in_XMM1_Da;
  VVar1.v_._M_elems[0] = (float)(int)extraout_XMM0_Qa;
  VVar1.v_._M_elems[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector3f)VVar1.v_._M_elems;
}

Assistant:

Vector3f GetPositionForEntryId(int entry_id) const {
    const PointIndex point_id = entry_to_point_id_map_[entry_id];
    Vector3f pos;
    pos_attribute_->ConvertValue(pos_attribute_->mapped_index(point_id),
                                 &pos[0]);
    return pos;
  }